

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O2

void __thiscall
VectorsTest_Int3OperatorOutput_Test::TestBody(VectorsTest_Int3OperatorOutput_Test *this)

{
  char *message;
  AssertHelper AStack_1b8;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  local_1a0._M_dataplus._M_p = (pointer)0xffffffff00000002;
  local_1a0._M_string_length._0_4_ = 0;
  pica::operator<<((ostream *)&os,(Vector3<int> *)&local_1a0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(2, -1, 0)\"","os.str()",(char (*) [11])"(2, -1, 0)",
             &local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0xbf,message);
    testing::internal::AssertHelper::operator=(&AStack_1b8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return;
}

Assistant:

TEST(VectorsTest, Int3OperatorOutput)
{
    std::ostringstream os;
    os << Int3(2, -1, 0);
    ASSERT_EQ("(2, -1, 0)", os.str());
}